

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

ImageOperandsMask __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::TranslateImageOperands
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  ImageOperandsMask IVar1;
  ushort uVar2;
  uint uVar3;
  ImageOperandsMask IVar4;
  uint uVar5;
  Capability local_c;
  
  IVar4 = ImageOperandsMaskNone;
  if (this->glslangIntermediate->useVulkanMemoryModel == true) {
    uVar2 = *(ushort *)coherentFlags;
    uVar5 = 0x300;
    if ((uVar2 & 0xbf) == 0) {
      uVar5 = uVar2 & 0xbf;
    }
    uVar3 = (uint)uVar2 << 4;
    uVar5 = uVar3 & 0x400 | uVar5;
    uVar3 = uVar3 & 0x800;
    IVar1 = uVar5 + uVar3;
    IVar4 = uVar3 + 0x4000 + uVar5;
    if ((this->builder).spvVersion < 0x10600) {
      IVar4 = IVar1;
    }
    if ((uVar2 & 0x100) == 0) {
      IVar4 = IVar1;
    }
    if (IVar4 != ImageOperandsMaskNone) {
      local_c = CapabilityVulkanMemoryModel;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,&local_c);
    }
  }
  return IVar4;
}

Assistant:

spv::ImageOperandsMask TGlslangToSpvTraverser::TranslateImageOperands(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::ImageOperandsMask mask = spv::ImageOperandsMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel())
        return mask;

    if (coherentFlags.volatil ||
        coherentFlags.anyCoherent()) {
        mask = mask | spv::ImageOperandsMakeTexelAvailableKHRMask |
                      spv::ImageOperandsMakeTexelVisibleKHRMask;
    }
    if (coherentFlags.nonprivate) {
        mask = mask | spv::ImageOperandsNonPrivateTexelKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::ImageOperandsVolatileTexelKHRMask;
    }
    if (coherentFlags.nontemporal && builder.getSpvVersion() >= spv::Spv_1_6) {
        mask = mask | spv::ImageOperandsNontemporalMask;
    }
    if (mask != spv::ImageOperandsMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}